

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O0

ActionMessage *
helics::apps::generatePortRequestReply(ActionMessage *param_1,shared_ptr<helics::Broker> *brk)

{
  string_view name;
  string_view str;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ActionMessage *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  brkptr;
  ActionMessage *rep;
  size_t in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  int index;
  ActionMessage *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff68;
  ActionMessage *pAVar3;
  undefined4 extraout_var_00;
  
  pAVar3 = in_RDI;
  ActionMessage::ActionMessage(in_stack_ffffffffffffff20,(action_t)((ulong)in_RDI >> 0x20));
  pAVar3->messageID = 0x14d;
  peVar2 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x201577);
  index = (int)((ulong)pAVar3 >> 0x20);
  iVar1 = (*peVar2->_vptr_Broker[0xb])();
  pAVar3 = (ActionMessage *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
  name._M_str = (char *)in_stack_ffffffffffffff00;
  name._M_len = in_stack_fffffffffffffef8;
  ActionMessage::name((ActionMessage *)0x2015be,name);
  peVar2 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2015cd);
  iVar1 = (*peVar2->_vptr_Broker[0xc])();
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(extraout_var_00,iVar1);
  gmlc::networking::extractInterfaceAndPortString(in_stack_ffffffffffffff68);
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xffffffffffffff2f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(__lhs,&this->first);
  std::__cxx11::string::operator_cast_to_basic_string_view(&this->first);
  str._M_str = (char *)in_stack_ffffffffffffff30;
  str._M_len = in_stack_ffffffffffffff28;
  ActionMessage::setString(pAVar3,index,str);
  std::__cxx11::string::~string(&this->first);
  std::__cxx11::string::~string(&this->first);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this);
  return in_RDI;
}

Assistant:

static ActionMessage generatePortRequestReply(const ActionMessage& /*cmd*/,
                                              std::shared_ptr<Broker>& brk)
{
    ActionMessage rep(CMD_PROTOCOL);
    rep.messageID = NEW_BROKER_INFORMATION;
    rep.name(brk->getIdentifier());
    auto brkptr = gmlc::networking::extractInterfaceAndPortString(brk->getAddress());
    rep.setString(0, std::string("?:") + brkptr.second);
    return rep;
}